

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFunctionSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index func_index)

{
  Module *pMVar1;
  bool bVar2;
  char *pcVar3;
  reference ppFVar4;
  ulong uVar5;
  string_view name_00;
  Binding local_b8;
  BinaryReaderIR *local_90;
  size_t local_88;
  string local_80;
  undefined1 local_60 [8];
  string dollar_name;
  Func *func;
  Index func_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BinaryReaderIR *)name._M_len;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar2) {
    Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  }
  else {
    pcVar3 = (char *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size
                               (&this->module_->funcs);
    if ((char *)(ulong)func_index < pcVar3) {
      ppFVar4 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                          (&this->module_->funcs,(ulong)func_index);
      dollar_name.field_2._8_8_ = *ppFVar4;
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
      }
      else {
        pMVar1 = this->module_;
        local_90 = this_local;
        local_88 = name_local._M_len;
        name_00._M_str = pcVar3;
        name_00._M_len = name_local._M_len;
        (anonymous_namespace)::MakeDollarName_abi_cxx11_
                  (&local_80,(_anonymous_namespace_ *)this_local,name_00);
        GetUniqueName((string *)local_60,this,&pMVar1->func_bindings,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::operator=((string *)dollar_name.field_2._8_8_,(string *)local_60);
        pMVar1 = this->module_;
        Binding::Binding(&local_b8,func_index);
        std::
        unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
        ::emplace<std::__cxx11::string&,wabt::Binding>
                  ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                    *)&pMVar1->func_bindings,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_b8);
        Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
        std::__cxx11::string::~string((string *)local_60);
      }
    }
    else {
      PrintError(this,"invalid function index: %u",(ulong)func_index);
      Result::Result((Result *)((long)&name_local._M_str + 4),Error);
    }
  }
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnFunctionSymbol(Index index,
                                        uint32_t flags,
                                        std::string_view name,
                                        Index func_index) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (func_index >= module_->funcs.size()) {
    PrintError("invalid function index: %" PRIindex, func_index);
    return Result::Error;
  }
  Func* func = module_->funcs[func_index];
  if (!func->name.empty()) {
    // The name section has already named this function.
    return Result::Ok;
  }
  std::string dollar_name =
      GetUniqueName(&module_->func_bindings, MakeDollarName(name));
  func->name = dollar_name;
  module_->func_bindings.emplace(dollar_name, Binding(func_index));
  return Result::Ok;
}